

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

StringRef __thiscall
llvm::yaml::ScalarNode::unescapeDoubleQuoted
          (ScalarNode *this,StringRef UnquotedValue,size_type i,SmallVectorImpl<char> *Storage)

{
  long lVar1;
  size_t sVar2;
  char cVar3;
  type tVar4;
  size_t sVar5;
  iterator pcVar6;
  iterator pcVar7;
  unsigned_long *puVar8;
  ScalarNode *pSVar9;
  char *pcVar10;
  StringRef local_5e0;
  StringRef local_5b0;
  uint local_59c;
  ScalarNode *pSStack_598;
  uint UnicodeScalarValue_2;
  char *local_590;
  StringRef local_588;
  uint local_574;
  ScalarNode *pSStack_570;
  uint UnicodeScalarValue_1;
  char *local_568;
  StringRef local_560;
  uint local_54c;
  char local_545;
  uint UnicodeScalarValue;
  char local_540 [8];
  ScalarNode *local_538;
  char *local_530;
  Twine local_528;
  undefined1 local_500 [8];
  Token T;
  char local_491;
  ScalarNode *local_490;
  char *local_488;
  undefined1 local_480 [8];
  StringRef Valid;
  SmallVectorImpl<char> *Storage_local;
  size_type i_local;
  ScalarNode *this_local;
  StringRef UnquotedValue_local;
  size_t local_440;
  unsigned_long local_3a0 [3];
  ScalarNode **local_388;
  undefined1 local_380 [16];
  char *local_370;
  ScalarNode *local_368;
  undefined1 *local_360;
  unsigned_long local_358 [3];
  ScalarNode **local_340;
  undefined1 local_338 [16];
  char *local_328;
  ScalarNode *local_320;
  undefined1 *local_318;
  unsigned_long local_310 [3];
  ScalarNode **local_2f8;
  undefined1 local_2f0 [16];
  unsigned_long local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  unsigned_long local_2c8 [3];
  ScalarNode **local_2b0;
  undefined1 local_2a8 [16];
  char *local_298;
  ScalarNode *local_290;
  undefined1 *local_288;
  unsigned_long local_280 [3];
  ScalarNode **local_268;
  undefined1 local_260 [16];
  unsigned_long local_250;
  char *local_248;
  undefined1 *local_240;
  unsigned_long local_238 [3];
  ScalarNode **local_220;
  undefined1 local_218 [16];
  char *local_208;
  ScalarNode *local_200;
  undefined1 *local_1f8;
  unsigned_long local_1f0 [3];
  ScalarNode **local_1d8;
  undefined1 local_1d0 [16];
  unsigned_long local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  unsigned_long local_1a8 [3];
  ScalarNode **local_190;
  undefined1 local_188 [16];
  char *local_178;
  ScalarNode *local_170;
  undefined1 *local_168;
  unsigned_long local_160 [3];
  StringRef *local_148;
  undefined1 local_140 [16];
  char *local_130;
  ScalarNode *local_128;
  undefined1 *local_120;
  unsigned_long local_118 [3];
  ScalarNode **local_100;
  undefined1 local_f8 [16];
  char *local_e8;
  ScalarNode *local_e0;
  undefined1 *local_d8;
  unsigned_long local_d0 [3];
  ScalarNode **local_b8;
  undefined1 local_b0 [16];
  char *local_a0;
  ScalarNode *local_98;
  undefined1 *local_90;
  unsigned_long local_88 [2];
  SmallVectorImpl<char> *local_78;
  StringRef *local_70;
  undefined1 local_68 [16];
  char *local_58;
  ScalarNode *local_50;
  undefined1 *local_48;
  ScalarNode **local_40;
  ScalarNode **local_38;
  ScalarNode **local_30;
  ScalarNode **local_28;
  ScalarNode **local_20;
  ScalarNode **local_18;
  ScalarNode **local_10;
  
  UnquotedValue_local.Data = (char *)UnquotedValue.Length;
  this_local = (ScalarNode *)UnquotedValue.Data;
  Valid.Length = (size_t)Storage;
  SmallVectorImpl<char>::clear(Storage);
  local_10 = &this_local;
  SmallVectorImpl<char>::reserve
            ((SmallVectorImpl<char> *)Valid.Length,(size_type)UnquotedValue_local.Data);
  Storage_local = (SmallVectorImpl<char> *)i;
  while( true ) {
    sVar2 = Valid.Length;
    if (Storage_local == (SmallVectorImpl<char> *)0xffffffffffffffff) {
      lVar1 = *(long *)Valid.Length;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)Valid.Length);
      pcVar6 = StringRef::begin((StringRef *)&this_local);
      pcVar7 = StringRef::end((StringRef *)&this_local);
      SmallVectorImpl<char>::insert<char_const*,void>
                ((SmallVectorImpl<char> *)sVar2,(iterator)(lVar1 + sVar5),pcVar6,pcVar7);
      sVar2 = *(size_t *)Valid.Length;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)Valid.Length);
      UnquotedValue_local.Length = sVar2;
      local_440 = sVar5;
      return stack0xfffffffffffffbb8;
    }
    local_480 = (undefined1  [8])StringRef::begin((StringRef *)&this_local);
    sVar2 = Valid.Length;
    Valid.Data = (char *)Storage_local;
    lVar1 = *(long *)Valid.Length;
    sVar5 = SmallVectorBase::size((SmallVectorBase *)Valid.Length);
    pcVar6 = StringRef::begin((StringRef *)local_480);
    pcVar7 = StringRef::end((StringRef *)local_480);
    SmallVectorImpl<char>::insert<char_const*,void>
              ((SmallVectorImpl<char> *)sVar2,(iterator)(lVar1 + sVar5),pcVar6,pcVar7);
    local_78 = Storage_local;
    local_88[1] = 0xffffffffffffffff;
    local_70 = (StringRef *)&this_local;
    puVar8 = std::min<unsigned_long>
                       ((unsigned_long *)&local_78,(unsigned_long *)&UnquotedValue_local);
    local_78 = (SmallVectorImpl<char> *)*puVar8;
    pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + (long)local_78);
    local_88[0] = (long)UnquotedValue_local.Data - (long)local_78;
    puVar8 = std::min<unsigned_long>(local_88 + 1,local_88);
    local_488 = (char *)*puVar8;
    local_48 = local_68;
    local_490 = pSVar9;
    this_local = pSVar9;
    UnquotedValue_local.Data = local_488;
    local_58 = local_488;
    local_50 = pSVar9;
    if (local_488 == (char *)0x0) break;
    cVar3 = StringRef::operator[]((StringRef *)&this_local,0);
    if ((cVar3 == '\n') || (cVar3 == '\r')) {
      local_491 = '\n';
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)Valid.Length,&local_491);
      local_18 = &this_local;
      if (((char *)0x1 < UnquotedValue_local.Data) &&
         ((cVar3 = StringRef::operator[]((StringRef *)&this_local,1), cVar3 == '\r' ||
          (cVar3 = StringRef::operator[]((StringRef *)&this_local,1), cVar3 == '\n')))) {
        local_b8 = &this_local;
        local_d0[2] = 1;
        local_d0[1] = 0xffffffffffffffff;
        puVar8 = std::min<unsigned_long>(local_d0 + 2,(unsigned_long *)&UnquotedValue_local);
        local_d0[2] = *puVar8;
        pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_d0[2]);
        local_d0[0] = (long)UnquotedValue_local.Data - local_d0[2];
        puVar8 = std::min<unsigned_long>(local_d0 + 1,local_d0);
        UnquotedValue_local.Data = (char *)*puVar8;
        local_90 = local_b0;
        this_local = pSVar9;
        local_a0 = UnquotedValue_local.Data;
        local_98 = pSVar9;
      }
      local_100 = &this_local;
      local_118[2] = 1;
      local_118[1] = 0xffffffffffffffff;
      puVar8 = std::min<unsigned_long>(local_118 + 2,(unsigned_long *)&UnquotedValue_local);
      local_118[2] = *puVar8;
      pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_118[2]);
      local_118[0] = (long)UnquotedValue_local.Data - local_118[2];
      puVar8 = std::min<unsigned_long>(local_118 + 1,local_118);
      UnquotedValue_local.Data = (char *)*puVar8;
      local_d8 = local_f8;
      this_local = pSVar9;
      local_e8 = UnquotedValue_local.Data;
      local_e0 = pSVar9;
    }
    else {
      local_20 = &this_local;
      if (UnquotedValue_local.Data != (char *)0x1) {
        local_160[2] = 1;
        local_160[1] = 0xffffffffffffffff;
        local_148 = (StringRef *)&this_local;
        puVar8 = std::min<unsigned_long>(local_160 + 2,(unsigned_long *)&UnquotedValue_local);
        local_160[2] = *puVar8;
        pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_160[2]);
        local_160[0] = (long)UnquotedValue_local.Data - local_160[2];
        puVar8 = std::min<unsigned_long>(local_160 + 1,local_160);
        UnquotedValue_local.Data = (char *)*puVar8;
        local_120 = local_140;
        T.Value.field_2._8_8_ = pSVar9;
        this_local = pSVar9;
        local_130 = UnquotedValue_local.Data;
        local_128 = pSVar9;
        cVar3 = StringRef::operator[]((StringRef *)&this_local,0);
        switch(cVar3) {
        case '\t':
        case 't':
          local_540[4] = 9;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 4);
          break;
        case '\n':
        case '\r':
          local_28 = &this_local;
          if (((char *)0x1 < UnquotedValue_local.Data) &&
             ((cVar3 = StringRef::operator[]((StringRef *)&this_local,1), cVar3 == '\r' ||
              (cVar3 = StringRef::operator[]((StringRef *)&this_local,1), cVar3 == '\n')))) {
            local_190 = &this_local;
            local_1a8[2] = 1;
            local_1a8[1] = 0xffffffffffffffff;
            puVar8 = std::min<unsigned_long>(local_1a8 + 2,(unsigned_long *)&UnquotedValue_local);
            local_1a8[2] = *puVar8;
            pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_1a8[2]);
            local_1a8[0] = (long)UnquotedValue_local.Data - local_1a8[2];
            puVar8 = std::min<unsigned_long>(local_1a8 + 1,local_1a8);
            local_530 = (char *)*puVar8;
            local_168 = local_188;
            local_538 = pSVar9;
            this_local = pSVar9;
            UnquotedValue_local.Data = local_530;
            local_178 = local_530;
            local_170 = pSVar9;
          }
          break;
        default:
          Token::Token((Token *)local_500);
          T._0_8_ = StringRef::begin((StringRef *)&this_local);
          T.Range.Data = (char *)0x1;
          Twine::Twine(&local_528,"Unrecognized escape code!");
          Node::setError(&this->super_Node,&local_528,(Token *)local_500);
          strlen("");
          Token::~Token((Token *)local_500);
          return stack0xfffffffffffffbb8;
        case ' ':
          UnicodeScalarValue._2_1_ = 0x20;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,
                     (char *)((long)&UnicodeScalarValue + 2));
          break;
        case '\"':
          UnicodeScalarValue._1_1_ = 0x22;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,
                     (char *)((long)&UnicodeScalarValue + 1));
          break;
        case '/':
          UnicodeScalarValue._0_1_ = 0x2f;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,(char *)&UnicodeScalarValue
                    );
          break;
        case '0':
          local_540[7] = 0;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 7);
          break;
        case 'L':
          encodeUTF8(0x2028,(SmallVectorImpl<char> *)Valid.Length);
          break;
        case 'N':
          encodeUTF8(0x85,(SmallVectorImpl<char> *)Valid.Length);
          break;
        case 'P':
          encodeUTF8(0x2029,(SmallVectorImpl<char> *)Valid.Length);
          break;
        case 'U':
          local_40 = &this_local;
          if ((char *)0x8 < UnquotedValue_local.Data) {
            local_2f8 = &this_local;
            local_310[2] = 1;
            local_310[1] = 8;
            puVar8 = std::min<unsigned_long>(local_310 + 2,(unsigned_long *)&UnquotedValue_local);
            local_310[2] = *puVar8;
            pcVar10 = (char *)((long)&(this_local->super_Node)._vptr_Node + local_310[2]);
            local_310[0] = (long)UnquotedValue_local.Data - local_310[2];
            puVar8 = std::min<unsigned_long>(local_310 + 1,local_310);
            local_5b0.Length = *puVar8;
            local_2d0 = local_2f0;
            local_5b0.Data = pcVar10;
            local_2e0 = local_5b0.Length;
            local_2d8 = pcVar10;
            tVar4 = StringRef::getAsInteger<unsigned_int>(&local_5b0,0x10,&local_59c);
            if (tVar4) {
              local_59c = 0xfffd;
            }
            encodeUTF8(local_59c,(SmallVectorImpl<char> *)Valid.Length);
            local_340 = &this_local;
            local_358[2] = 8;
            local_358[1] = 0xffffffffffffffff;
            puVar8 = std::min<unsigned_long>(local_358 + 2,(unsigned_long *)&UnquotedValue_local);
            local_358[2] = *puVar8;
            pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_358[2]);
            local_358[0] = (long)UnquotedValue_local.Data - local_358[2];
            puVar8 = std::min<unsigned_long>(local_358 + 1,local_358);
            UnquotedValue_local.Data = (char *)*puVar8;
            local_318 = local_338;
            this_local = pSVar9;
            local_328 = UnquotedValue_local.Data;
            local_320 = pSVar9;
          }
          break;
        case '\\':
          local_545 = '\\';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,&local_545);
          break;
        case '_':
          encodeUTF8(0xa0,(SmallVectorImpl<char> *)Valid.Length);
          break;
        case 'a':
          local_540[6] = 7;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 6);
          break;
        case 'b':
          local_540[5] = 8;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 5);
          break;
        case 'e':
          UnicodeScalarValue._3_1_ = 0x1b;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,
                     (char *)((long)&UnicodeScalarValue + 3));
          break;
        case 'f':
          local_540[1] = 0xc;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 1);
          break;
        case 'n':
          local_540[3] = 10;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 3);
          break;
        case 'r':
          local_540[0] = '\r';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540);
          break;
        case 'u':
          local_38 = &this_local;
          if ((char *)0x4 < UnquotedValue_local.Data) {
            local_268 = &this_local;
            local_280[2] = 1;
            local_280[1] = 4;
            puVar8 = std::min<unsigned_long>(local_280 + 2,(unsigned_long *)&UnquotedValue_local);
            local_280[2] = *puVar8;
            pcVar10 = (char *)((long)&(this_local->super_Node)._vptr_Node + local_280[2]);
            local_280[0] = (long)UnquotedValue_local.Data - local_280[2];
            puVar8 = std::min<unsigned_long>(local_280 + 1,local_280);
            local_588.Length = *puVar8;
            local_240 = local_260;
            local_588.Data = pcVar10;
            local_250 = local_588.Length;
            local_248 = pcVar10;
            tVar4 = StringRef::getAsInteger<unsigned_int>(&local_588,0x10,&local_574);
            if (tVar4) {
              local_574 = 0xfffd;
            }
            encodeUTF8(local_574,(SmallVectorImpl<char> *)Valid.Length);
            local_2b0 = &this_local;
            local_2c8[2] = 4;
            local_2c8[1] = 0xffffffffffffffff;
            puVar8 = std::min<unsigned_long>(local_2c8 + 2,(unsigned_long *)&UnquotedValue_local);
            local_2c8[2] = *puVar8;
            pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_2c8[2]);
            local_2c8[0] = (long)UnquotedValue_local.Data - local_2c8[2];
            puVar8 = std::min<unsigned_long>(local_2c8 + 1,local_2c8);
            local_590 = (char *)*puVar8;
            local_288 = local_2a8;
            pSStack_598 = pSVar9;
            this_local = pSVar9;
            UnquotedValue_local.Data = local_590;
            local_298 = local_590;
            local_290 = pSVar9;
          }
          break;
        case 'v':
          local_540[2] = 0xb;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)Valid.Length,local_540 + 2);
          break;
        case 'x':
          local_30 = &this_local;
          if ((char *)0x2 < UnquotedValue_local.Data) {
            local_1d8 = &this_local;
            local_1f0[2] = 1;
            local_1f0[1] = 2;
            puVar8 = std::min<unsigned_long>(local_1f0 + 2,(unsigned_long *)&UnquotedValue_local);
            local_1f0[2] = *puVar8;
            pcVar10 = (char *)((long)&(this_local->super_Node)._vptr_Node + local_1f0[2]);
            local_1f0[0] = (long)UnquotedValue_local.Data - local_1f0[2];
            puVar8 = std::min<unsigned_long>(local_1f0 + 1,local_1f0);
            local_560.Length = *puVar8;
            local_1b0 = local_1d0;
            local_560.Data = pcVar10;
            local_1c0 = local_560.Length;
            local_1b8 = pcVar10;
            tVar4 = StringRef::getAsInteger<unsigned_int>(&local_560,0x10,&local_54c);
            if (tVar4) {
              local_54c = 0xfffd;
            }
            encodeUTF8(local_54c,(SmallVectorImpl<char> *)Valid.Length);
            local_220 = &this_local;
            local_238[2] = 2;
            local_238[1] = 0xffffffffffffffff;
            puVar8 = std::min<unsigned_long>(local_238 + 2,(unsigned_long *)&UnquotedValue_local);
            local_238[2] = *puVar8;
            pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_238[2]);
            local_238[0] = (long)UnquotedValue_local.Data - local_238[2];
            puVar8 = std::min<unsigned_long>(local_238 + 1,local_238);
            local_568 = (char *)*puVar8;
            local_1f8 = local_218;
            pSStack_570 = pSVar9;
            this_local = pSVar9;
            UnquotedValue_local.Data = local_568;
            local_208 = local_568;
            local_200 = pSVar9;
          }
        }
        local_388 = &this_local;
        local_3a0[2] = 1;
        local_3a0[1] = 0xffffffffffffffff;
        puVar8 = std::min<unsigned_long>(local_3a0 + 2,(unsigned_long *)&UnquotedValue_local);
        local_3a0[2] = *puVar8;
        pSVar9 = (ScalarNode *)((long)&(this_local->super_Node)._vptr_Node + local_3a0[2]);
        local_3a0[0] = (long)UnquotedValue_local.Data - local_3a0[2];
        puVar8 = std::min<unsigned_long>(local_3a0 + 1,local_3a0);
        UnquotedValue_local.Data = (char *)*puVar8;
        local_360 = local_380;
        this_local = pSVar9;
        local_370 = UnquotedValue_local.Data;
        local_368 = pSVar9;
      }
    }
    strlen("\\\r\n");
    Storage_local =
         (SmallVectorImpl<char> *)StringRef::find_first_of((StringRef *)&this_local,local_5e0,0);
  }
  __assert_fail("!UnquotedValue.empty() && \"Can\'t be empty!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                ,0x785,
                "StringRef llvm::yaml::ScalarNode::unescapeDoubleQuoted(StringRef, StringRef::size_type, SmallVectorImpl<char> &) const"
               );
}

Assistant:

StringRef ScalarNode::unescapeDoubleQuoted( StringRef UnquotedValue
                                          , StringRef::size_type i
                                          , SmallVectorImpl<char> &Storage)
                                          const {
  // Use Storage to build proper value.
  Storage.clear();
  Storage.reserve(UnquotedValue.size());
  for (; i != StringRef::npos; i = UnquotedValue.find_first_of("\\\r\n")) {
    // Insert all previous chars into Storage.
    StringRef Valid(UnquotedValue.begin(), i);
    Storage.insert(Storage.end(), Valid.begin(), Valid.end());
    // Chop off inserted chars.
    UnquotedValue = UnquotedValue.substr(i);

    assert(!UnquotedValue.empty() && "Can't be empty!");

    // Parse escape or line break.
    switch (UnquotedValue[0]) {
    case '\r':
    case '\n':
      Storage.push_back('\n');
      if (   UnquotedValue.size() > 1
          && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
        UnquotedValue = UnquotedValue.substr(1);
      UnquotedValue = UnquotedValue.substr(1);
      break;
    default:
      if (UnquotedValue.size() == 1)
        // TODO: Report error.
        break;
      UnquotedValue = UnquotedValue.substr(1);
      switch (UnquotedValue[0]) {
      default: {
          Token T;
          T.Range = StringRef(UnquotedValue.begin(), 1);
          setError("Unrecognized escape code!", T);
          return "";
        }
      case '\r':
      case '\n':
        // Remove the new line.
        if (   UnquotedValue.size() > 1
            && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
          UnquotedValue = UnquotedValue.substr(1);
        // If this was just a single byte newline, it will get skipped
        // below.
        break;
      case '0':
        Storage.push_back(0x00);
        break;
      case 'a':
        Storage.push_back(0x07);
        break;
      case 'b':
        Storage.push_back(0x08);
        break;
      case 't':
      case 0x09:
        Storage.push_back(0x09);
        break;
      case 'n':
        Storage.push_back(0x0A);
        break;
      case 'v':
        Storage.push_back(0x0B);
        break;
      case 'f':
        Storage.push_back(0x0C);
        break;
      case 'r':
        Storage.push_back(0x0D);
        break;
      case 'e':
        Storage.push_back(0x1B);
        break;
      case ' ':
        Storage.push_back(0x20);
        break;
      case '"':
        Storage.push_back(0x22);
        break;
      case '/':
        Storage.push_back(0x2F);
        break;
      case '\\':
        Storage.push_back(0x5C);
        break;
      case 'N':
        encodeUTF8(0x85, Storage);
        break;
      case '_':
        encodeUTF8(0xA0, Storage);
        break;
      case 'L':
        encodeUTF8(0x2028, Storage);
        break;
      case 'P':
        encodeUTF8(0x2029, Storage);
        break;
      case 'x': {
          if (UnquotedValue.size() < 3)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 2).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(2);
          break;
        }
      case 'u': {
          if (UnquotedValue.size() < 5)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 4).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(4);
          break;
        }
      case 'U': {
          if (UnquotedValue.size() < 9)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 8).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(8);
          break;
        }
      }
      UnquotedValue = UnquotedValue.substr(1);
    }
  }
  Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
  return StringRef(Storage.begin(), Storage.size());
}